

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O1

void writesf_open(t_writesf *x,t_symbol *s,int argc,t_atom *argv)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  int iVar2;
  float fVar3;
  t_soundfiler_writeargs wa;
  int local_64;
  t_atom *local_60;
  t_atom *local_58;
  _soundfile_type *p_Stack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  long lStack_30;
  undefined8 local_28;
  
  local_38 = 0;
  lStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = (t_atom *)0x0;
  p_Stack_50 = (_soundfile_type *)0x0;
  local_28 = 0;
  local_64 = argc;
  local_60 = argv;
  if (x->x_state != STATE_IDLE) {
    writesf_stop(x);
  }
  iVar1 = soundfiler_parsewriteargs
                    (&local_64,(int *)&local_60,&local_58,(t_soundfiler_writeargs *)argv);
  if (iVar1 != 0 || local_28._4_4_ != 0) {
    pd_error(x,"usage: open [flags] filename...");
    post("flags: -bytes <n> %s -big -little -rate <n>",sf_typeargs);
    return;
  }
  if ((((int)local_28 != 0) || (lStack_30 != 0)) || (local_38 != -1)) {
    pd_error(x,"writesf~ open: normalize/onset/nframes argument ignored");
  }
  if (local_64 != 0) {
    pd_error(x,"writesf~ open: extra argument(s) ignored");
  }
  __mutex = &x->x_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (x->x_requestcode != REQUEST_NOTHING) {
    do {
      pthread_cond_signal((pthread_cond_t *)&x->x_requestcondition);
      pthread_cond_wait((pthread_cond_t *)&x->x_answercondition,(pthread_mutex_t *)__mutex);
    } while (x->x_requestcode != REQUEST_NOTHING);
  }
  x->x_filename = *(char **)local_58;
  (x->x_sf).sf_type = p_Stack_50;
  iVar1 = (int)local_48;
  if ((int)local_48 < 1) {
    fVar3 = x->x_insamplerate;
    if (fVar3 <= 0.0) {
      fVar3 = sys_getsr();
    }
    iVar1 = (int)fVar3;
  }
  (x->x_sf).sf_samplerate = iVar1;
  iVar1 = 2;
  if (2 < local_48._4_4_) {
    iVar1 = local_48._4_4_;
  }
  (x->x_sf).sf_bytespersample = iVar1;
  (x->x_sf).sf_bigendian = (int)uStack_40;
  iVar1 = iVar1 * (x->x_sf).sf_nchannels;
  (x->x_sf).sf_bytesperframe = iVar1;
  x->x_frameswritten = 0;
  x->x_requestcode = REQUEST_OPEN;
  x->x_fifohead = 0;
  x->x_fifotail = 0;
  x->x_eof = 0;
  x->x_fileerror = 0;
  x->x_state = STATE_STARTUP;
  iVar2 = x->x_bufsize - x->x_bufsize % (iVar1 * 0x80);
  x->x_fifosize = iVar2;
  iVar2 = iVar2 / (iVar1 * x->x_vecsize * 0x10);
  x->x_sigperiod = iVar2;
  x->x_sigcountdown = iVar2;
  pthread_cond_signal((pthread_cond_t *)&x->x_requestcondition);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

static void writesf_open(t_writesf *x, t_symbol *s, int argc, t_atom *argv)
{
    t_soundfiler_writeargs wa = {0};
    if (x->x_state != STATE_IDLE)
        writesf_stop(x);
    if (soundfiler_parsewriteargs(x, &argc, &argv, &wa) || wa.wa_ascii)
    {
        pd_error(x, "usage: open [flags] filename...");
        post("flags: -bytes <n> %s -big -little -rate <n>", sf_typeargs);
        return;
    }
    if (wa.wa_normalize || wa.wa_onsetframes || (wa.wa_nframes != SFMAXFRAMES))
        pd_error(x, "writesf~ open: normalize/onset/nframes argument ignored");
    if (argc)
        pd_error(x, "writesf~ open: extra argument(s) ignored");
    pthread_mutex_lock(&x->x_mutex);
        /* make sure that the child thread has finished writing */
    while (x->x_requestcode != REQUEST_NOTHING)
    {
        sfread_cond_signal(&x->x_requestcondition);
        sfread_cond_wait(&x->x_answercondition, &x->x_mutex);
    }
    x->x_filename = wa.wa_filesym->s_name;
    x->x_sf.sf_type = wa.wa_type;
    if (wa.wa_samplerate > 0)
        x->x_sf.sf_samplerate = wa.wa_samplerate;
    else if (x->x_insamplerate > 0)
        x->x_sf.sf_samplerate = x->x_insamplerate;
    else x->x_sf.sf_samplerate = sys_getsr();
    x->x_sf.sf_bytespersample =
        (wa.wa_bytespersample > 2 ? wa.wa_bytespersample : 2);
    x->x_sf.sf_bigendian = wa.wa_bigendian;
    x->x_sf.sf_bytesperframe = x->x_sf.sf_nchannels * x->x_sf.sf_bytespersample;
    x->x_frameswritten = 0;
    x->x_requestcode = REQUEST_OPEN;
    x->x_fifotail = 0;
    x->x_fifohead = 0;
    x->x_eof = 0;
    x->x_fileerror = 0;
    x->x_state = STATE_STARTUP;
        /* set fifosize from bufsize.  fifosize must be a
        multiple of the number of bytes eaten for each DSP
        tick.  */
    x->x_fifosize = x->x_bufsize - (x->x_bufsize %
        (x->x_sf.sf_bytesperframe * MAXVECSIZE));
        /* arrange for the "request" condition to be signaled 16
            times per buffer */
    x->x_sigcountdown = x->x_sigperiod = (x->x_fifosize /
            (16 * (x->x_sf.sf_bytesperframe * x->x_vecsize)));
    sfread_cond_signal(&x->x_requestcondition);
    pthread_mutex_unlock(&x->x_mutex);
}